

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

QString * __thiscall
LdConfigDirWrapper::getFieldName
          (QString *__return_storage_ptr__,LdConfigDirWrapper *this,size_t fieldId)

{
  int iVar1;
  char *pcVar2;
  bool is32bit;
  size_t fieldId_local;
  LdConfigDirWrapper *this_local;
  
  if ((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.m_Exe == (Executable *)0x0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    iVar1 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
              [0xb])();
    switch(fieldId) {
    case 0:
      QString::QString(__return_storage_ptr__,"Size");
      break;
    case 1:
      QString::QString(__return_storage_ptr__,"TimeDateStamp");
      break;
    case 2:
      QString::QString(__return_storage_ptr__,"MajorVersion");
      break;
    case 3:
      QString::QString(__return_storage_ptr__,"MinorVersion");
      break;
    case 4:
      QString::QString(__return_storage_ptr__,"GlobalFlagsClear");
      break;
    case 5:
      QString::QString(__return_storage_ptr__,"GlobalFlagsSet");
      break;
    case 6:
      QString::QString(__return_storage_ptr__,"CriticalSectionDefaultTimeout");
      break;
    case 7:
      QString::QString(__return_storage_ptr__,"DeCommitFreeBlockThreshold");
      break;
    case 8:
      QString::QString(__return_storage_ptr__,"DeCommitTotalFreeThreshold");
      break;
    case 9:
      QString::QString(__return_storage_ptr__,"LockPrefixTable");
      break;
    case 10:
      QString::QString(__return_storage_ptr__,"MaximumAllocationSize");
      break;
    case 0xb:
      QString::QString(__return_storage_ptr__,"VirtualMemoryThreshold");
      break;
    case 0xc:
      pcVar2 = "ProcessAffinityMask";
      if (iVar1 == 0x20) {
        pcVar2 = "ProcessHeapFlags";
      }
      QString::QString(__return_storage_ptr__,pcVar2);
      break;
    case 0xd:
      pcVar2 = "ProcessHeapFlags";
      if (iVar1 == 0x20) {
        pcVar2 = "ProcessAffinityMask";
      }
      QString::QString(__return_storage_ptr__,pcVar2);
      break;
    case 0xe:
      QString::QString(__return_storage_ptr__,"CSDVersion");
      break;
    case 0xf:
      QString::QString(__return_storage_ptr__,"DependentLoadFlags");
      break;
    case 0x10:
      QString::QString(__return_storage_ptr__,"EditList");
      break;
    case 0x11:
      QString::QString(__return_storage_ptr__,"SecurityCookie");
      break;
    case 0x12:
      QString::QString(__return_storage_ptr__,"SEHandlerTable");
      break;
    case 0x13:
      QString::QString(__return_storage_ptr__,"SEHandlerCount");
      break;
    case 0x14:
      QString::QString(__return_storage_ptr__,"GuardCFCheckFunctionPtr");
      break;
    case 0x15:
      QString::QString(__return_storage_ptr__,"GuardCFDispatchFunctionPointer");
      break;
    case 0x16:
      QString::QString(__return_storage_ptr__,"GuardCFFunctionTable");
      break;
    case 0x17:
      QString::QString(__return_storage_ptr__,"GuardCFFunctionCount");
      break;
    case 0x18:
      QString::QString(__return_storage_ptr__,"GuardFlags");
      break;
    case 0x19:
      QString::QString(__return_storage_ptr__,"CodeIntegrity.Flags");
      break;
    case 0x1a:
      QString::QString(__return_storage_ptr__,"CodeIntegrity.Catalog");
      break;
    case 0x1b:
      QString::QString(__return_storage_ptr__,"CodeIntegrity.CatalogOffset");
      break;
    case 0x1c:
      QString::QString(__return_storage_ptr__,"CodeIntegrity.Reserved");
      break;
    case 0x1d:
      QString::QString(__return_storage_ptr__,"GuardAddressTakenIatEntryTable");
      break;
    case 0x1e:
      QString::QString(__return_storage_ptr__,"GuardAddressTakenIatEntryCount");
      break;
    case 0x1f:
      QString::QString(__return_storage_ptr__,"GuardLongJumpTargetTable");
      break;
    case 0x20:
      QString::QString(__return_storage_ptr__,"GuardLongJumpTargetCount");
      break;
    case 0x21:
      QString::QString(__return_storage_ptr__,"DynamicValueRelocTable");
      break;
    case 0x22:
      QString::QString(__return_storage_ptr__,"CHPEMetadataPointer");
      break;
    case 0x23:
      QString::QString(__return_storage_ptr__,"GuardRFFailureRoutine");
      break;
    case 0x24:
      QString::QString(__return_storage_ptr__,"GuardRFFailureRoutineFunctionPointer");
      break;
    case 0x25:
      QString::QString(__return_storage_ptr__,"DynamicValueRelocTableOffset");
      break;
    case 0x26:
      QString::QString(__return_storage_ptr__,"DynamicValueRelocTableSection");
      break;
    case 0x27:
      QString::QString(__return_storage_ptr__,"Reserved2");
      break;
    case 0x28:
      QString::QString(__return_storage_ptr__,"GuardRFVerifyStackPointerFunctionPointer");
      break;
    case 0x29:
      QString::QString(__return_storage_ptr__,"HotPatchTableOffset");
      break;
    case 0x2a:
      QString::QString(__return_storage_ptr__,"Reserved3");
      break;
    case 0x2b:
      QString::QString(__return_storage_ptr__,"EnclaveConfigurationPointer");
      break;
    case 0x2c:
      QString::QString(__return_storage_ptr__,"VolatileMetadataPointer");
      break;
    case 0x2d:
      QString::QString(__return_storage_ptr__,"GuardEHContinuationTable");
      break;
    case 0x2e:
      QString::QString(__return_storage_ptr__,"GuardEHContinuationCount");
      break;
    default:
      (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
        super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString LdConfigDirWrapper::getFieldName(size_t fieldId)
{
    if (!m_Exe) return "";
    const bool is32bit = (m_Exe->getBitMode() == Executable::BITS_32);
    switch (fieldId) {
        case SIZE : return "Size";
        case TIMEST : return "TimeDateStamp";
        case MAJOR_VER : return "MajorVersion";
        case MINOR_VER : return "MinorVersion";
        case GLOBAL_FLAGS_CLEAR : return "GlobalFlagsClear";
        case GLOBAL_FLAGS_SET : return "GlobalFlagsSet";
        case CRITICAT_SEC_TIMEOUT : return "CriticalSectionDefaultTimeout";
        case DECOMMIT_FREE : return "DeCommitFreeBlockThreshold";
        case DECOMMIT_TOTAL : return "DeCommitTotalFreeThreshold";
        case LOCK_PREFIX : return "LockPrefixTable";
        case MAX_ALLOC : return "MaximumAllocationSize";
        case VIRTUAL_MEM : return "VirtualMemoryThreshold";
        case PROC_HEAP_FLAGS32 : //PROC_AFF_MASK64
        {
            return (is32bit) ? "ProcessHeapFlags" : "ProcessAffinityMask";
        }
        case PROC_AFF_MASK32 : // PROC_HEAP_FLAGS64
        {
            return (is32bit) ? "ProcessAffinityMask" : "ProcessHeapFlags";
        }
        case CSD_VER : return "CSDVersion";
        case DEPENDENT_LOAD_FLAGS : return "DependentLoadFlags";
        case EDIT_LIST : return "EditList";
        case SEC_COOKIE : return "SecurityCookie";
        case SEH_TABLE : return "SEHandlerTable";
        case SEH_COUNT : return "SEHandlerCount";
        // W8.1 part :
        case GUARD_CHECK : return "GuardCFCheckFunctionPtr";
        case GUARD_DISPATCH : return "GuardCFDispatchFunctionPointer";
        case GUARD_TABLE: return "GuardCFFunctionTable";
        case GUARD_COUNT: return "GuardCFFunctionCount";
        case GUARD_FLAGS: return "GuardFlags";
        // W10 part:
        case CODE_INTEGRITY_FLAGS: return "CodeIntegrity.Flags"; //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.Flags
        case CODE_INTEGRITY_CATALOG:  return "CodeIntegrity.Catalog";  //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.Catalog
        case CODE_INTEGRITY_CATALOG_OFFSET:  return "CodeIntegrity.CatalogOffset"; //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.CatalogOffset
        case CODE_INTEGRITY_RESERVED:  return "CodeIntegrity.Reserved"; //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.Reserved

        case GUARD_ADDR_IAT_ENTRY_TABLE:  return "GuardAddressTakenIatEntryTable";
        case GUARD_ADDR_IAT_ENTRY_COUNT:  return "GuardAddressTakenIatEntryCount";
        case GUARD_LONG_JUMP_TABLE:  return "GuardLongJumpTargetTable";
        case GUARD_LONG_JUMP_COUNT:  return "GuardLongJumpTargetCount";

        case DYNAMIC_VAL_RELOC:  return "DynamicValueRelocTable";
        case CHPE_METADATA_PTR:  return "CHPEMetadataPointer";
        case GUARD_FAILURE_ROUTINE:  return "GuardRFFailureRoutine";
        case GUARD_FAILURE_ROUTINE_FUNC_PTR:  return "GuardRFFailureRoutineFunctionPointer";
        case DYNAMIC_VAL_RELOC_TABLE_OFFSET:  return "DynamicValueRelocTableOffset";
        case DYNAMIC_VAL_RELOC_TABLE_SECTION: return "DynamicValueRelocTableSection";
        case RESERVED2:  return "Reserved2";
        case GUARD_VERIFY_STACK_PTR:  return "GuardRFVerifyStackPointerFunctionPointer";
        case HOT_PATCH_TABLE_OFFSET:  return "HotPatchTableOffset";
        case RESERVED3:  return "Reserved3";
        case ENCLAVE_CONFIG_PTR:  return "EnclaveConfigurationPointer";
        case VOLATILE_METADATA_PTR:  return "VolatileMetadataPointer";
        case GUARD_EH_CONT_TABLE:  return "GuardEHContinuationTable";
        case GUARD_EH_CONT_COUNT:  return "GuardEHContinuationCount";
    }
    return getName();
}